

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::findBucketWithHash<QString>
          (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this,QString *key,size_t hash)

{
  long lVar1;
  ulong uVar2;
  Span *pSVar3;
  char16_t *pcVar4;
  long lVar5;
  byte bVar6;
  bool bVar7;
  Span *pSVar8;
  Span *pSVar9;
  ulong uVar10;
  QStringView rhs;
  Bucket BVar11;
  QStringView lhs;
  
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  uVar10 = uVar2 - 1 & hash;
  pSVar8 = pSVar3 + (uVar10 >> 7);
  uVar10 = (ulong)((uint)uVar10 & 0x7f);
  bVar6 = pSVar8->offsets[uVar10];
  if (bVar6 != 0xff) {
    pcVar4 = (key->d).ptr;
    lVar5 = (key->d).size;
    do {
      lVar1 = (ulong)bVar6 * 0x80 + (ulong)bVar6 * 8;
      if ((*(long *)((pSVar8->entries->storage).data + lVar1 + 0x10) == lVar5) &&
         (rhs.m_data = pcVar4, rhs.m_size = lVar5,
         lhs.m_data = *(storage_type_conflict **)((pSVar8->entries->storage).data + lVar1 + 8),
         lhs.m_size = lVar5, bVar7 = QtPrivate::equalStrings(lhs,rhs), bVar7)) break;
      uVar10 = uVar10 + 1;
      if (uVar10 == 0x80) {
        pSVar9 = pSVar8 + 1;
        pSVar8 = pSVar3;
        if (((long)pSVar9 - (long)pSVar3 >> 4) * -0x71c71c71c71c71c7 - (uVar2 >> 7) != 0) {
          pSVar8 = pSVar9;
        }
        uVar10 = 0;
      }
      bVar6 = pSVar8->offsets[uVar10];
    } while (bVar6 != 0xff);
  }
  BVar11.index = uVar10;
  BVar11.span = pSVar8;
  return BVar11;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }